

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O0

void __thiscall
google::protobuf::FileOptions::SerializeWithCachedSizes(FileOptions *this,CodedOutputStream *output)

{
  bool bVar1;
  FileOptions_OptimizeMode value;
  int iVar2;
  char *pcVar3;
  string *psVar4;
  UninterpretedOption *value_00;
  UnknownFieldSet *pUVar5;
  int local_1c;
  int i;
  CodedOutputStream *output_local;
  FileOptions *this_local;
  
  bVar1 = has_java_package(this);
  if (bVar1) {
    java_package_abi_cxx11_(this);
    pcVar3 = (char *)std::__cxx11::string::data();
    java_package_abi_cxx11_(this);
    iVar2 = std::__cxx11::string::length();
    internal::WireFormat::VerifyUTF8String(pcVar3,iVar2,SERIALIZE);
    psVar4 = java_package_abi_cxx11_(this);
    internal::WireFormatLite::WriteString(1,psVar4,output);
  }
  bVar1 = has_java_outer_classname(this);
  if (bVar1) {
    java_outer_classname_abi_cxx11_(this);
    pcVar3 = (char *)std::__cxx11::string::data();
    java_outer_classname_abi_cxx11_(this);
    iVar2 = std::__cxx11::string::length();
    internal::WireFormat::VerifyUTF8String(pcVar3,iVar2,SERIALIZE);
    psVar4 = java_outer_classname_abi_cxx11_(this);
    internal::WireFormatLite::WriteString(8,psVar4,output);
  }
  bVar1 = has_optimize_for(this);
  if (bVar1) {
    value = optimize_for(this);
    internal::WireFormatLite::WriteEnum(9,value,output);
  }
  bVar1 = has_java_multiple_files(this);
  if (bVar1) {
    bVar1 = java_multiple_files(this);
    internal::WireFormatLite::WriteBool(10,bVar1,output);
  }
  bVar1 = has_go_package(this);
  if (bVar1) {
    go_package_abi_cxx11_(this);
    pcVar3 = (char *)std::__cxx11::string::data();
    go_package_abi_cxx11_(this);
    iVar2 = std::__cxx11::string::length();
    internal::WireFormat::VerifyUTF8String(pcVar3,iVar2,SERIALIZE);
    psVar4 = go_package_abi_cxx11_(this);
    internal::WireFormatLite::WriteString(0xb,psVar4,output);
  }
  bVar1 = has_cc_generic_services(this);
  if (bVar1) {
    bVar1 = cc_generic_services(this);
    internal::WireFormatLite::WriteBool(0x10,bVar1,output);
  }
  bVar1 = has_java_generic_services(this);
  if (bVar1) {
    bVar1 = java_generic_services(this);
    internal::WireFormatLite::WriteBool(0x11,bVar1,output);
  }
  bVar1 = has_py_generic_services(this);
  if (bVar1) {
    bVar1 = py_generic_services(this);
    internal::WireFormatLite::WriteBool(0x12,bVar1,output);
  }
  bVar1 = has_java_generate_equals_and_hash(this);
  if (bVar1) {
    bVar1 = java_generate_equals_and_hash(this);
    internal::WireFormatLite::WriteBool(0x14,bVar1,output);
  }
  for (local_1c = 0; iVar2 = uninterpreted_option_size(this), local_1c < iVar2;
      local_1c = local_1c + 1) {
    value_00 = uninterpreted_option(this,local_1c);
    internal::WireFormatLite::WriteMessageMaybeToArray(999,(MessageLite *)value_00,output);
  }
  internal::ExtensionSet::SerializeWithCachedSizes(&this->_extensions_,1000,0x20000000,output);
  pUVar5 = unknown_fields(this);
  bVar1 = UnknownFieldSet::empty(pUVar5);
  if (!bVar1) {
    pUVar5 = unknown_fields(this);
    internal::WireFormat::SerializeUnknownFields(pUVar5,output);
  }
  return;
}

Assistant:

void FileOptions::SerializeWithCachedSizes(
    ::google::protobuf::io::CodedOutputStream* output) const {
  // optional string java_package = 1;
  if (has_java_package()) {
    ::google::protobuf::internal::WireFormat::VerifyUTF8String(
      this->java_package().data(), this->java_package().length(),
      ::google::protobuf::internal::WireFormat::SERIALIZE);
    ::google::protobuf::internal::WireFormatLite::WriteString(
      1, this->java_package(), output);
  }

  // optional string java_outer_classname = 8;
  if (has_java_outer_classname()) {
    ::google::protobuf::internal::WireFormat::VerifyUTF8String(
      this->java_outer_classname().data(), this->java_outer_classname().length(),
      ::google::protobuf::internal::WireFormat::SERIALIZE);
    ::google::protobuf::internal::WireFormatLite::WriteString(
      8, this->java_outer_classname(), output);
  }

  // optional .google.protobuf.FileOptions.OptimizeMode optimize_for = 9 [default = SPEED];
  if (has_optimize_for()) {
    ::google::protobuf::internal::WireFormatLite::WriteEnum(
      9, this->optimize_for(), output);
  }

  // optional bool java_multiple_files = 10 [default = false];
  if (has_java_multiple_files()) {
    ::google::protobuf::internal::WireFormatLite::WriteBool(10, this->java_multiple_files(), output);
  }

  // optional string go_package = 11;
  if (has_go_package()) {
    ::google::protobuf::internal::WireFormat::VerifyUTF8String(
      this->go_package().data(), this->go_package().length(),
      ::google::protobuf::internal::WireFormat::SERIALIZE);
    ::google::protobuf::internal::WireFormatLite::WriteString(
      11, this->go_package(), output);
  }

  // optional bool cc_generic_services = 16 [default = false];
  if (has_cc_generic_services()) {
    ::google::protobuf::internal::WireFormatLite::WriteBool(16, this->cc_generic_services(), output);
  }

  // optional bool java_generic_services = 17 [default = false];
  if (has_java_generic_services()) {
    ::google::protobuf::internal::WireFormatLite::WriteBool(17, this->java_generic_services(), output);
  }

  // optional bool py_generic_services = 18 [default = false];
  if (has_py_generic_services()) {
    ::google::protobuf::internal::WireFormatLite::WriteBool(18, this->py_generic_services(), output);
  }

  // optional bool java_generate_equals_and_hash = 20 [default = false];
  if (has_java_generate_equals_and_hash()) {
    ::google::protobuf::internal::WireFormatLite::WriteBool(20, this->java_generate_equals_and_hash(), output);
  }

  // repeated .google.protobuf.UninterpretedOption uninterpreted_option = 999;
  for (int i = 0; i < this->uninterpreted_option_size(); i++) {
    ::google::protobuf::internal::WireFormatLite::WriteMessageMaybeToArray(
      999, this->uninterpreted_option(i), output);
  }

  // Extension range [1000, 536870912)
  _extensions_.SerializeWithCachedSizes(
      1000, 536870912, output);

  if (!unknown_fields().empty()) {
    ::google::protobuf::internal::WireFormat::SerializeUnknownFields(
        unknown_fields(), output);
  }
}